

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinFoodWeb_kry.c
# Opt level: O3

void WebRate(sunrealtype xx,sunrealtype yy,sunrealtype *cxy,sunrealtype *ratesxy,void *user_data)

{
  long lVar1;
  long lVar2;
  sunindextype i;
  long lVar3;
  sunrealtype temp;
  double dVar4;
  
  lVar1 = *(long *)((long)user_data + 0x400);
  lVar2 = 0;
  do {
    dVar4 = 0.0;
    lVar3 = 0;
    do {
      dVar4 = dVar4 + cxy[lVar3] * *(double *)(*(long *)(lVar1 + lVar2 * 8) + lVar3 * 8);
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    ratesxy[lVar2] = dVar4;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  lVar1 = *(long *)((long)user_data + 0x408);
  lVar2 = 0;
  do {
    ratesxy[lVar2] =
         (*(double *)(lVar1 + lVar2 * 8) * (xx * yy + 1.0) + ratesxy[lVar2]) * cxy[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 6);
  return;
}

Assistant:

static void WebRate(sunrealtype xx, sunrealtype yy, sunrealtype* cxy,
                    sunrealtype* ratesxy, void* user_data)
{
  sunindextype i;
  sunrealtype fac;
  UserData data;

  data = (UserData)user_data;

  for (i = 0; i < NUM_SPECIES; i++)
  {
    ratesxy[i] = DotProd(NUM_SPECIES, cxy, acoef[i]);
  }

  fac = ONE + ALPHA * xx * yy;

  for (i = 0; i < NUM_SPECIES; i++)
  {
    ratesxy[i] = cxy[i] * (bcoef[i] * fac + ratesxy[i]);
  }
}